

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docio.cc
# Opt level: O2

fdb_status docio_read_doc_length(docio_handle *handle,docio_length *length,uint64_t offset)

{
  err_log_callback *log_callback;
  undefined8 uVar1;
  docio_length length_00;
  undefined8 uVar2;
  uint8_t uVar3;
  byte bVar4;
  int64_t iVar5;
  fdb_status fVar6;
  undefined1 auVar7 [16];
  docio_length dVar8;
  docio_length _length;
  
  _length.keylen = 0;
  _length.metalen = 0;
  _length.bodylen = 0;
  _length.bodylen_ondisk = 0;
  _length.flag = '\0';
  _length.checksum = '\0';
  _length.reserved = 0;
  log_callback = handle->log_callback;
  iVar5 = _docio_read_length(handle,offset,&_length,log_callback,true);
  length_00 = _length;
  if (iVar5 < 0) {
    fVar6 = (fdb_status)iVar5;
  }
  else {
    uVar3 = _length.checksum;
    auVar7[0] = -((char)_length.keylen == '\0');
    auVar7[1] = -(_length.keylen._1_1_ == '\0');
    auVar7[2] = -((char)_length.metalen == '\0');
    auVar7[3] = -(_length.metalen._1_1_ == '\0');
    auVar7[4] = -((char)_length.bodylen == '\0');
    auVar7[5] = -(_length.bodylen._1_1_ == '\0');
    auVar7[6] = -(_length.bodylen._2_1_ == '\0');
    auVar7[7] = -(_length.bodylen._3_1_ == '\0');
    auVar7[8] = -((char)_length.bodylen_ondisk == '\0');
    auVar7[9] = -(_length.bodylen_ondisk._1_1_ == '\0');
    auVar7[10] = -(_length.bodylen_ondisk._2_1_ == '\0');
    auVar7[0xb] = -(_length.bodylen_ondisk._3_1_ == '\0');
    auVar7[0xc] = -(_length.flag == '\0');
    auVar7[0xd] = -(_length.checksum == '\0');
    auVar7[0xe] = -((char)_length.reserved == '\0');
    auVar7[0xf] = -(_length.reserved._1_1_ == '\0');
    if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe | (ushort)(auVar7[0xf] >> 7) << 0xf)
        == 0xffff) {
      length->keylen = 0;
      length->metalen = 0;
      length->bodylen = 0;
      length->bodylen_ondisk = 0;
      length->flag = '\0';
      length->checksum = '\0';
      length->reserved = 0;
      fVar6 = FDB_RESULT_SUCCESS;
    }
    else {
      uVar1 = _length._0_8_;
      uVar2 = _length._8_8_;
      bVar4 = _docio_length_checksum(_length,handle);
      if (bVar4 == uVar3) {
        dVar8 = _docio_length_decode(length_00);
        *length = dVar8;
        fVar6 = FDB_RESULT_SUCCESS;
        if ((ushort)(dVar8.keylen + 0xf) < 0x10) {
          fVar6 = FDB_RESULT_FILE_CORRUPTION;
          fdb_log_impl(log_callback,2,FDB_RESULT_FILE_CORRUPTION,
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                       ,"docio_read_doc_length",0x3f8,
                       "Error in decoding the doc length metadata in file %s crc %x keylen %d metalen %d bodylen %d bodylen_ondisk %d offset %lu"
                       ,handle->file->filename,(ulong)bVar4,(ulong)(length_00._0_4_ & 0xffff),
                       (ulong)(length_00._2_4_ & 0xffff),(ulong)uVar1 >> 0x20,uVar2,offset);
        }
      }
      else {
        fVar6 = FDB_RESULT_CHECKSUM_ERROR;
        fdb_log_impl(log_callback,2,FDB_RESULT_CHECKSUM_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                     ,"docio_read_doc_length",0x3ed,
                     "doc_length checksum mismatch error in a database file \'%s\' crc %x != %x (crc in doc) keylen %d metalen %d bodylen %d bodylen_ondisk %d offset %lu"
                     ,handle->file->filename,(ulong)bVar4,(ulong)uVar2 >> 0x28 & 0xff,
                     (ulong)(length_00._0_4_ & 0xffff),(ulong)(length_00._2_4_ & 0xffff),
                     (ulong)uVar1 >> 0x20,uVar2,offset);
      }
    }
  }
  return fVar6;
}

Assistant:

fdb_status docio_read_doc_length(struct docio_handle *handle,
                                 struct docio_length *length,
                                 uint64_t offset)
{
    uint8_t checksum;
    int64_t _offset;
    struct docio_length _length, zero_length;
    err_log_callback *log_callback = handle->log_callback;

    _offset = _docio_read_length(handle, offset, &_length, log_callback, true);
    if (_offset < 0) {
        return (fdb_status) _offset;
    }

    memset(&zero_length, 0x0, sizeof(struct docio_length));
    if (memcmp(&_length, &zero_length, sizeof(struct docio_length)) == 0) {
        // If all the fields in docio_length are zero, then it means that the rest of
        // the current block, which starts at offset, is zero-filled and can be skipped.
        *length = zero_length;
        return FDB_RESULT_SUCCESS;
    }

    // checksum check
    checksum = _docio_length_checksum(_length, handle);
    if (checksum != _length.checksum) {
        fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_CHECKSUM_ERROR,
                "doc_length checksum mismatch error in a database file '%s'"
                " crc %x != %x (crc in doc) keylen %d metalen %d bodylen %d "
                "bodylen_ondisk %d offset %" _F64, handle->file->filename,
                checksum, _length.checksum, _length.keylen, _length.metalen,
                _length.bodylen, _length.bodylen_ondisk, offset);
        return FDB_RESULT_CHECKSUM_ERROR;
    }

    *length = _docio_length_decode(_length);
    if (length->keylen == 0 || length->keylen > FDB_MAX_KEYLEN_INTERNAL) {
        fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_FILE_CORRUPTION,
                "Error in decoding the doc length metadata in file %s"
                " crc %x keylen %d metalen %d bodylen %d "
                "bodylen_ondisk %d offset %" _F64, handle->file->filename,
                checksum, _length.keylen, _length.metalen,
                _length.bodylen, _length.bodylen_ondisk, offset);
        return FDB_RESULT_FILE_CORRUPTION;
    }

    return FDB_RESULT_SUCCESS;
}